

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlru_cache.hpp
# Opt level: O2

void __thiscall
cappuccino::
tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::tlru_cache(tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
             *this,size_t capacity,float max_load_factor)

{
  _Rb_tree_header *p_Var1;
  __hashtable *__this;
  allocator_type local_2e;
  allocator_type local_2d;
  float local_2c;
  
  (this->m_lock).m_lock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  this->m_used_size = 0;
  *(undefined8 *)((long)&(this->m_lock).m_lock.super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_lock).m_lock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_lock).m_lock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_lock).m_lock.super___mutex_base._M_mutex + 8) = 0;
  local_2c = max_load_factor;
  std::
  vector<cappuccino::tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
  ::vector(&this->m_elements,capacity,&local_2d);
  (this->m_keyed_elements)._M_h._M_buckets = &(this->m_keyed_elements)._M_h._M_single_bucket;
  (this->m_keyed_elements)._M_h._M_bucket_count = 1;
  (this->m_keyed_elements)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_keyed_elements)._M_h._M_element_count = 0;
  (this->m_keyed_elements)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_keyed_elements)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_keyed_elements)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::list
            (&this->m_lru_list,capacity,&local_2e);
  (this->m_ttl_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->m_ttl_list)._M_t._M_impl.super__Rb_tree_header;
  (this->m_ttl_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_ttl_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_ttl_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_ttl_list)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_lru_end)._M_node = (_List_node_base *)0x0;
  std::iota<std::_List_iterator<unsigned_long>,int>
            ((this->m_lru_list).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl._M_node.super__List_node_base._M_next,
             (_List_iterator<unsigned_long>)&this->m_lru_list,0);
  (this->m_lru_end)._M_node =
       (this->m_lru_list).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       _M_node.super__List_node_base._M_next;
  (this->m_keyed_elements)._M_h._M_rehash_policy._M_max_load_factor = local_2c;
  (this->m_keyed_elements)._M_h._M_rehash_policy._M_next_resize = 0;
  std::__detail::
  _Rehash_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_std::integral_constant<bool,_true>_>
  ::reserve((_Rehash_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_std::integral_constant<bool,_true>_>
             *)&this->m_keyed_elements,capacity);
  return;
}

Assistant:

explicit tlru_cache(size_t capacity, float max_load_factor = 1.0f) : m_elements(capacity), m_lru_list(capacity)
    {
        std::iota(m_lru_list.begin(), m_lru_list.end(), 0);
        m_lru_end = m_lru_list.begin();

        m_keyed_elements.max_load_factor(max_load_factor);
        m_keyed_elements.reserve(capacity);
    }